

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_config.cc
# Opt level: O1

bool anon_unknown.dwarf_4a080::StringToInt<int>(int *out,char *str)

{
  int iVar1;
  int *piVar2;
  longlong lVar3;
  char *end;
  char *local_20;
  
  iVar1 = OPENSSL_isdigit((uint)(byte)*str);
  if ((iVar1 != 0) || (*str == '-')) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    lVar3 = strtoll(str,&local_20,10);
    if (((int)lVar3 == lVar3) && (*out = (int)lVar3, *piVar2 != 0x22)) {
      return *local_20 == '\0';
    }
  }
  return false;
}

Assistant:

bool StringToInt(T *out, const char *str) {
  static_assert(std::is_integral<T>::value, "not an integral type");

  // |strtoull| allows leading '-' with wraparound. Additionally, both
  // functions accept empty strings and leading whitespace.
  if (!OPENSSL_isdigit(static_cast<unsigned char>(*str)) &&
      (!std::is_signed<T>::value || *str != '-')) {
    return false;
  }

  errno = 0;
  char *end;
  if (std::is_signed<T>::value) {
    static_assert(sizeof(T) <= sizeof(long long),
                  "type too large for long long");
    long long value = strtoll(str, &end, 10);
    if (value < static_cast<long long>(std::numeric_limits<T>::min()) ||
        value > static_cast<long long>(std::numeric_limits<T>::max())) {
      return false;
    }
    *out = static_cast<T>(value);
  } else {
    static_assert(sizeof(T) <= sizeof(unsigned long long),
                  "type too large for unsigned long long");
    unsigned long long value = strtoull(str, &end, 10);
    if (value >
        static_cast<unsigned long long>(std::numeric_limits<T>::max())) {
      return false;
    }
    *out = static_cast<T>(value);
  }

  // Check for overflow and that the whole input was consumed.
  return errno != ERANGE && *end == '\0';
}